

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Heap2LocalPass::doWalkFunction(Heap2LocalPass *this,Function *func)

{
  Module *wasm;
  PassOptions *passOptions;
  Heap2Local local_458;
  Function *local_18;
  Function *func_local;
  Heap2LocalPass *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  wasm = Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
         ::getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>_>
                      ).
                      super_PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
                    );
  passOptions = Pass::getPassOptions((Pass *)this);
  Heap2Local::Heap2Local(&local_458,func,wasm,passOptions);
  Heap2Local::~Heap2Local(&local_458);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // Multiple rounds of optimization may work in theory, as once we turn one
    // allocation into locals, references written to its fields become
    // references written to locals, which we may see do not escape. However,
    // this does not work yet, since we do not remove the original allocation -
    // we just "detach" it from other things and then depend on other
    // optimizations to remove it. That means this pass must be interleaved with
    // vacuum, in particular, to optimize such nested allocations.
    // TODO Consider running multiple iterations here, and running vacuum in
    //      between them.
    Heap2Local(func, *getModule(), getPassOptions());
  }